

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O2

dynhds_entry * Curl_dynhds_get(dynhds *dynhds,char *name,size_t namelen)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (dynhds->hds_len <= uVar2) {
      return (dynhds_entry *)0x0;
    }
    if ((dynhds->hds[uVar2]->namelen == namelen) &&
       (iVar1 = curl_strnequal(dynhds->hds[uVar2]->name,name,namelen), iVar1 != 0)) break;
    uVar2 = uVar2 + 1;
  }
  return dynhds->hds[uVar2];
}

Assistant:

struct dynhds_entry *Curl_dynhds_get(struct dynhds *dynhds, const char *name,
                                     size_t namelen)
{
  size_t i;
  for(i = 0; i < dynhds->hds_len; ++i) {
    if(dynhds->hds[i]->namelen == namelen &&
       strncasecompare(dynhds->hds[i]->name, name, namelen)) {
      return dynhds->hds[i];
    }
  }
  return NULL;
}